

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgLoadNeededValues.hpp
# Opt level: O2

void TasGrid::loadNeededValues<true,true>
               (function<void_(const_double_*,_double_*,_unsigned_long)> *model,
               TasmanianSparseGrid *grid,size_t num_threads)

{
  int iVar1;
  BaseCanonicalGrid *pBVar2;
  pointer ptVar3;
  runtime_error *this;
  thread *w;
  size_t sVar4;
  pointer ptVar5;
  pointer __args_1;
  size_t sVar6;
  size_t thread_id;
  pointer __args;
  size_type __n;
  long lVar7;
  int local_13c;
  TasmanianSparseGrid *local_138;
  function<void_(const_double_*,_double_*,_unsigned_long)> *local_130;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  vector<double,_std::allocator<double>_> values;
  Wrapper2D<double> ywrap;
  Wrapper2D<double> xwrap;
  anon_class_56_7_dc8e8c63_for__M_head_impl local_d8;
  vector<double,_std::allocator<double>_> points;
  mutex checked_out_lock;
  vector<bool,_std::allocator<bool>_> checked_out;
  
  pBVar2 = (grid->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  local_130 = model;
  if (pBVar2 == (BaseCanonicalGrid *)0x0) {
    if (grid->using_dynamic_construction == true) goto LAB_00113fc3;
  }
  else {
    sVar4 = (size_t)*(int *)(pBVar2 + 0x14);
    iVar1 = *(int *)(pBVar2 + 0x20);
    __n = (size_type)iVar1;
    local_13c = 0;
    if (sVar4 != 0) {
      local_13c = iVar1;
    }
    local_138 = grid;
    if (grid->using_dynamic_construction != false) {
LAB_00113fc3:
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,
                 "ERROR: cannot call loadNeededPoints() addon when isUsingConstruction() is true");
      goto LAB_00113ff9;
    }
    if (*(int *)(pBVar2 + 0x14) != 0) {
      if (iVar1 != 0) {
        if (*(int *)(pBVar2 + 0x48) != 0) {
          TasGrid::TasmanianSparseGrid::clearRefinement();
        }
        TasmanianSparseGrid::getLoadedPoints(&points,grid);
        std::vector<double,_std::allocator<double>_>::vector
                  (&values,__n * sVar4,(allocator_type *)&local_d8);
        pBVar2 = (grid->base)._M_t.
                 super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                 .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
        if (pBVar2 == (BaseCanonicalGrid *)0x0) {
          sVar6 = 0;
        }
        else {
          sVar6 = (size_t)*(int *)(pBVar2 + 0x10);
        }
        xwrap.data = points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        ywrap.data = values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        ywrap.stride = sVar4;
        xwrap.stride = sVar6;
        if (num_threads == 0) {
          __args_1 = values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          __args = points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar7 = 0; lVar7 < (long)__n; lVar7 = lVar7 + 1) {
            std::function<void_(const_double_*,_double_*,_unsigned_long)>::operator()
                      (local_130,__args,__args_1,0);
            __args_1 = __args_1 + sVar4;
            __args = __args + sVar6;
          }
        }
        else {
          local_d8.thread_id = local_d8.thread_id & 0xffffffffffffff00;
          std::vector<bool,_std::allocator<bool>_>::vector
                    (&checked_out,__n,(bool *)&local_d8,(allocator_type *)&checked_out_lock);
          checked_out_lock.super___mutex_base._M_mutex._16_8_ = 0;
          checked_out_lock.super___mutex_base._M_mutex.__data.__list.__prev =
               (__pthread_internal_list *)0x0;
          checked_out_lock.super___mutex_base._M_mutex.__align = 0;
          checked_out_lock.super___mutex_base._M_mutex._8_8_ = 0;
          checked_out_lock.super___mutex_base._M_mutex.__data.__list.__next =
               (__pthread_internal_list *)0x0;
          workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&workers,num_threads);
          for (sVar4 = 0;
              ptVar3 = workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_finish,
              ptVar5 = workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_start, num_threads != sVar4; sVar4 = sVar4 + 1) {
            local_d8.checked_out_lock = &checked_out_lock;
            local_d8.checked_out = &checked_out;
            local_d8.model = local_130;
            local_d8.thread_id = sVar4;
            local_d8.num_points = &local_13c;
            local_d8.xwrap = &xwrap;
            local_d8.ywrap = &ywrap;
            std::vector<std::thread,std::allocator<std::thread>>::
            emplace_back<TasGrid::loadNeededValues<true,true>(std::function<void(double_const*,double*,unsigned_long)>,TasGrid::TasmanianSparseGrid&,unsigned_long)::_lambda()_1_>
                      ((vector<std::thread,std::allocator<std::thread>> *)&workers,&local_d8);
          }
          for (; ptVar5 != ptVar3; ptVar5 = ptVar5 + 1) {
            std::thread::join();
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&workers);
          std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    (&checked_out.super__Bvector_base<std::allocator<bool>_>);
        }
        TasGrid::TasmanianSparseGrid::loadNeededValues((vector *)local_138);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&values.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&points.super__Vector_base<double,_std::allocator<double>_>);
      }
      return;
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this,"ERROR: cannot call loadNeededPoints() addon when the grid has no outputs");
LAB_00113ff9:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void loadNeededValues(std::function<void(double const x[], double y[], size_t thread_id)> model, TasmanianSparseGrid &grid, size_t num_threads){
    int num_points = (overwrite_loaded) ? grid.getNumLoaded() : grid.getNumNeeded();
    int num_outputs = grid.getNumOutputs();
    if (grid.isUsingConstruction()) throw std::runtime_error("ERROR: cannot call loadNeededPoints() addon when isUsingConstruction() is true");
    if (num_outputs == 0) throw std::runtime_error("ERROR: cannot call loadNeededPoints() addon when the grid has no outputs");
    if (num_points == 0) return; // nothing to do here
    if (overwrite_loaded && (grid.getNumNeeded() != 0)) grid.clearRefinement(); // using loaded points only, clear the refinement

    // get the points and values
    auto points = (overwrite_loaded) ? grid.getLoadedPoints() : grid.getNeededPoints();
    std::vector<double> values(Utils::size_mult(num_points, num_outputs));

    // divide logically into strips
    Utils::Wrapper2D<double> xwrap(grid.getNumDimensions(), points.data());
    Utils::Wrapper2D<double> ywrap(num_outputs, values.data());

    if (parallel_construction && (num_threads > 0)){
        std::vector<bool> checked_out(num_points, false);
        std::mutex checked_out_lock;

        std::vector<std::thread> workers;
        workers.reserve(num_threads);
        for(size_t thread_id=0; thread_id<num_threads; thread_id++){
            workers.emplace_back( // create a new worker thread
                [&, thread_id](void)->void{
                    int sample = 0;
                    do{
                        { // find the next sample
                            std::lock_guard<std::mutex> lock(checked_out_lock);
                            while ((sample < num_points) && checked_out[sample]) sample++;
                            if (sample < num_points) checked_out[sample] = true;
                        }
                        if (sample < num_points) // if found, compute the next sample
                            model(xwrap.getStrip(sample), ywrap.getStrip(sample), thread_id);
                    }while(sample < num_points);
                }
            );
        }

        for(auto &w : workers) w.join(); // wait till finished

    }else{
        for(int i=0; i<num_points; i++)
            model(xwrap.getStrip(i), ywrap.getStrip(i), 0);
    }

    grid.loadNeededPoints(values);
}